

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase441::run(TestCase441 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  Reader reader_00;
  Builder root;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestListDefaults>
            (&root,&builder.super_MessageBuilder);
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  StructBuilder::asReader(&root._builder);
  reader._reader.capTable = (CapTableReader *)uStack_120;
  reader._reader.segment = (SegmentReader *)local_128;
  reader._reader.data = (void *)local_118;
  reader._reader.pointers = (WirePointer *)uStack_110;
  reader._reader._32_8_ = local_108;
  reader._reader._40_8_ = uStack_100;
  checkTestMessage(reader);
  builder_01._builder.capTable = root._builder.capTable;
  builder_01._builder.segment = root._builder.segment;
  builder_01._builder.data = root._builder.data;
  builder_01._builder.pointers = root._builder.pointers;
  builder_01._builder.dataSize = root._builder.dataSize;
  builder_01._builder.pointerCount = root._builder.pointerCount;
  builder_01._builder._38_2_ = root._builder._38_2_;
  checkTestMessage(builder_01);
  StructBuilder::asReader(&root._builder);
  reader_00._reader.capTable = (CapTableReader *)uStack_150;
  reader_00._reader.segment = (SegmentReader *)local_158;
  reader_00._reader.data = (void *)local_148;
  reader_00._reader.pointers = (WirePointer *)uStack_140;
  reader_00._reader._32_8_ = local_138;
  reader_00._reader._40_8_ = uStack_130;
  checkTestMessage(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, BuildListDefaults) {
  MallocMessageBuilder builder;
  TestListDefaults::Builder root = builder.getRoot<TestListDefaults>();

  initTestMessage(root);
  checkTestMessage(root.asReader());
  checkTestMessage(root);
  checkTestMessage(root.asReader());
}